

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void kokkosp_pop_profile_region(void)

{
  KokkosTools::SpaceTimeStack::kokkosp_pop_profile_region();
  return;
}

Assistant:

void kokkosp_pop_profile_region() { global_state->pop_region(); }